

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cc
# Opt level: O0

void __thiscall re2c::Skeleton::~Skeleton(Skeleton *this)

{
  Node *pNVar1;
  path_t *ppVar2;
  Node *this_00;
  Skeleton *this_local;
  
  pNVar1 = this->nodes;
  if (pNVar1 != (Node *)0x0) {
    ppVar2 = pNVar1[-1].suffix;
    this_00 = pNVar1 + (long)ppVar2;
    while (pNVar1 != this_00) {
      this_00 = this_00 + -1;
      Node::~Node(this_00);
    }
    operator_delete__(&pNVar1[-1].suffix,(long)ppVar2 * 0xb0 + 8);
  }
  std::
  map<re2c::rule_rank_t,_re2c::rule_info_t,_std::less<re2c::rule_rank_t>,_std::allocator<std::pair<const_re2c::rule_rank_t,_re2c::rule_info_t>_>_>
  ::~map(&this->rules);
  std::__cxx11::string::~string((string *)&this->cond);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Skeleton::~Skeleton ()
{
	delete [] nodes;
}